

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barker.cpp
# Opt level: O0

void __thiscall AI::Barker::update(Barker *this,float dt)

{
  float dt_local;
  Barker *this_local;
  
  if (((this->barking & 1U) != 0) &&
     (this->timeRemaining = this->timeRemaining - dt, this->timeRemaining <= 0.0)) {
    this->barking = false;
    this->timeRemaining = 0.0;
  }
  return;
}

Assistant:

void Barker::update(float dt)
	{
		if (!barking)
		{
			return;
		}

		timeRemaining -= dt;

		if (timeRemaining <= 0.f)
		{
			barking = false;
			timeRemaining = 0.f;
		}
	}